

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::quadratic_cost_type
          (quadratic_cost_type<double> *this,quadratic_cost_type<double> *other,int n)

{
  long lVar1;
  int __n2;
  int __n2_1;
  
  this->obj = other->obj;
  std::make_unique<double[]>((size_t)&this->linear_elements);
  std::make_unique<baryonyx::itm::quadratic_cost_type<double>::quad[]>
            ((size_t)&this->quadratic_elements);
  std::make_unique<int[]>((size_t)&this->indices);
  if (n < 1) {
    if (n < 0) goto LAB_00164df9;
  }
  else {
    memmove((this->linear_elements)._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl,
            (other->linear_elements)._M_t.
            super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
            super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl,(ulong)(uint)n << 3);
  }
  memmove((this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl,
          (other->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl,(ulong)(n + 1) << 2);
LAB_00164df9:
  lVar1 = (long)(other->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (0 < lVar1) {
    memmove((this->quadratic_elements)._M_t.
            super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
            _M_head_impl,
            (other->quadratic_elements)._M_t.
            super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
            .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
            _M_head_impl,lVar1 << 4);
    return;
  }
  return;
}

Assistant:

quadratic_cost_type(const quadratic_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(std::make_unique<quad[]>(other.indices[n]))
      , indices(std::make_unique<int[]>(n + 1))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
        std::copy_n(other.indices.get(), n + 1, indices.get());
        std::copy_n(other.quadratic_elements.get(),
                    other.indices[n],
                    quadratic_elements.get());
    }